

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extendable_data_dictionary.cpp
# Opt level: O3

optional<bidfx_public_api::price::pixie::FieldDef> * __thiscall
bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByFid
          (optional<bidfx_public_api::price::pixie::FieldDef> *__return_storage_ptr__,
          ExtendableDataDictionary *this,int fid)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  if ((-1 < fid) &&
     (p_Var3 = (this->field_defs_by_fid_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
     p_Var3 != (_Base_ptr)0x0)) {
    p_Var4 = &(this->field_defs_by_fid_)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var4->_M_header;
    do {
      if (fid <= (int)p_Var3[1]._M_color) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < fid];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var4) && ((int)p_Var2[1]._M_color <= fid)) {
      FieldDef::FieldDef((FieldDef *)__return_storage_ptr__,(FieldDef *)&p_Var2[1]._M_parent);
      bVar1 = true;
      goto LAB_0017e41f;
    }
  }
  bVar1 = false;
LAB_0017e41f:
  (__return_storage_ptr__->
  super__Optional_base<bidfx_public_api::price::pixie::FieldDef,_false,_false>)._M_payload.
  super__Optional_payload<bidfx_public_api::price::pixie::FieldDef,_true,_false,_false>.
  super__Optional_payload_base<bidfx_public_api::price::pixie::FieldDef>._M_engaged = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::optional<FieldDef> ExtendableDataDictionary::FieldDefByFid(int fid)
{
    if (fid < 0)
    {
        return {};
    }
    else
    {
        auto it = field_defs_by_fid_.find(fid);
        if (it == field_defs_by_fid_.end())
        {
            return {};
        }
        return it->second;
    }
}